

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O3

void __thiscall
sglr::GLContext::GLContext
          (GLContext *this,RenderContext *context,TestLog *log,deUint32 logFlags,IVec4 *baseViewport
          )

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int i;
  deUint32 dVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  CallLogWrapper *this_00;
  
  dVar3 = (*context->_vptr_RenderContext[2])(context);
  (this->super_Context).m_type.super_ApiType.m_bits = dVar3;
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__GLContext_0217dd58;
  this->m_context = context;
  this->m_log = log;
  this->m_logFlags = logFlags;
  lVar5 = 0;
  do {
    (this->m_baseViewport).m_data[lVar5] = baseViewport->m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  iVar4 = (this->m_baseViewport).m_data[2];
  iVar2 = (this->m_baseViewport).m_data[3];
  (this->m_curViewport).m_data[0] = 0;
  (this->m_curViewport).m_data[1] = 0;
  (this->m_curViewport).m_data[2] = iVar4;
  (this->m_curViewport).m_data[3] = iVar2;
  (this->m_curScissor).m_data[0] = 0;
  (this->m_curScissor).m_data[1] = 0;
  (this->m_curScissor).m_data[2] = iVar4;
  (this->m_curScissor).m_data[3] = iVar2;
  this->m_readFramebufferBinding = 0;
  this->m_drawFramebufferBinding = 0;
  this->m_wrapper = (CallLogWrapper *)0x0;
  p_Var1 = &(this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header;
  (this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header;
  (this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header;
  (this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header;
  (this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_programs).super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_programs).super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_programs).super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  iVar4 = (*context->_vptr_RenderContext[3])(context);
  this_00 = (CallLogWrapper *)operator_new(0x18);
  glu::CallLogWrapper::CallLogWrapper(this_00,(Functions *)CONCAT44(extraout_var,iVar4),log);
  this->m_wrapper = this_00;
  this_00->m_enableLog = (bool)((byte)logFlags & 1);
  (*((Functions *)CONCAT44(extraout_var,iVar4))->viewport)
            (baseViewport->m_data[0],baseViewport->m_data[1],baseViewport->m_data[2],
             baseViewport->m_data[3]);
  return;
}

Assistant:

GLContext::GLContext (const glu::RenderContext& context, tcu::TestLog& log, deUint32 logFlags, const tcu::IVec4& baseViewport)
	: Context					(context.getType())
	, m_context					(context)
	, m_log						(log)
	, m_logFlags				(logFlags)
	, m_baseViewport			(baseViewport)
	, m_curViewport				(0, 0, m_baseViewport.z(), m_baseViewport.w())
	, m_curScissor				(0, 0, m_baseViewport.z(), m_baseViewport.w())
	, m_readFramebufferBinding	(0)
	, m_drawFramebufferBinding	(0)
	, m_wrapper					(DE_NULL)
{
	const glw::Functions& gl = m_context.getFunctions();

	// Logging?
	m_wrapper = new glu::CallLogWrapper(gl, log);
	m_wrapper->enableLogging((logFlags & GLCONTEXT_LOG_CALLS) != 0);

	// Setup base viewport. This offset is active when default framebuffer is active.
	// \note Calls related to setting up base viewport are not included in log.
	gl.viewport(baseViewport.x(), baseViewport.y(), baseViewport.z(), baseViewport.w());
}